

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
boost::numeric::ublas::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
          *v)

{
  ulong uVar1;
  long lVar2;
  ostream *poVar3;
  size_type i;
  ulong uVar4;
  locale local_1d0 [8];
  char *local_1c8 [4];
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> s;
  undefined8 local_1a0 [2];
  undefined4 auStack_190 [88];
  
  uVar1 = *(ulong *)(*(long *)v + 8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  lVar2 = *(long *)os;
  *(undefined4 *)((long)auStack_190 + *(long *)(_s + -0x18)) =
       *(undefined4 *)(os + *(long *)(lVar2 + -0x18) + 0x18);
  std::locale::locale((locale *)local_1c8,(locale *)(os + *(long *)(lVar2 + -0x18) + 0xd0));
  std::ios::imbue(local_1d0);
  std::locale::~locale(local_1d0);
  std::locale::~locale((locale *)local_1c8);
  *(undefined8 *)((long)local_1a0 + *(long *)(_s + -0x18)) =
       *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8);
  poVar3 = std::operator<<((ostream *)&s,'[');
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"](");
  if (uVar1 != 0) {
    std::ostream::_M_insert<double>
              (*(double *)
                (*(long *)(*(long *)v + 0x20) + *(long *)(*(long *)v + 8) * *(long *)(v + 8) * 8));
  }
  for (uVar4 = 1; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    std::operator<<((ostream *)&s,',');
    std::ostream::_M_insert<double>
              (*(double *)
                (*(long *)(*(long *)v + 8) * *(long *)(v + 8) * 8 + *(long *)(*(long *)v + 0x20) +
                uVar4 * 8));
  }
  std::operator<<((ostream *)&s,')');
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<((ostream *)os,local_1c8[0]);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  return (basic_ostream<char,_std::char_traits<char>_> *)poVar3;
}

Assistant:

std::basic_ostream<E, T> &operator << (std::basic_ostream<E, T> &os,
                                           const vector_expression<VE> &v) {
        typedef typename VE::size_type size_type;
        size_type size = v ().size ();
        std::basic_ostringstream<E, T, std::allocator<E> > s;
        s.flags (os.flags ());
        s.imbue (os.getloc ());
        s.precision (os.precision ());
        s << '[' << size << "](";
        if (size > 0)
            s << v () (0);
        for (size_type i = 1; i < size; ++ i)
            s << ',' << v () (i);
        s << ')';
        return os << s.str ().c_str ();
    }